

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::alerts_dropped_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,alerts_dropped_alert *this)

{
  bool bVar1;
  char *pcVar2;
  int local_30;
  int idx;
  allocator<char> local_1a;
  undefined1 local_19;
  alerts_dropped_alert *local_18;
  alerts_dropped_alert *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (alerts_dropped_alert *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"dropped alerts: ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  for (local_30 = 0; local_30 < 0x61; local_30 = local_30 + 1) {
    bVar1 = std::bitset<97UL>::test(&this->dropped_alerts,(long)local_30);
    if (bVar1) {
      pcVar2 = alert_name(local_30);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alerts_dropped_alert::message() const
	{
		std::string ret = "dropped alerts: ";

		TORRENT_ASSERT(int(dropped_alerts.size()) == num_alert_types);
		for (int idx = 0; idx < num_alert_types; ++idx)
		{
			if (!dropped_alerts.test(std::size_t(idx))) continue;
			ret += alert_name(idx);
			ret += ' ';
		}

		return ret;
	}